

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O0

void __thiscall antlr::Parser::Parser(Parser *this,TokenBuffer *input)

{
  TokenBuffer *in_RDI;
  RefCount<antlr::ParserInputState> *unaff_retaddr;
  ParserInputState *this_00;
  TokenBuffer *p;
  
  in_RDI->_vptr_TokenBuffer = (_func_int **)&PTR__Parser_0050d470;
  this_00 = (ParserInputState *)&in_RDI->input;
  p = in_RDI;
  operator_new(0x40);
  ParserInputState::ParserInputState(this_00,in_RDI);
  RefCount<antlr::ParserInputState>::RefCount(unaff_retaddr,(ParserInputState *)p);
  in_RDI->nMarkers = 0;
  in_RDI->markerOffset = 0;
  in_RDI->numToConsume = 0;
  return;
}

Assistant:

Parser(TokenBuffer* input)
	: inputState(new ParserInputState(input)), astFactory(0), traceDepth(0)
	{
	}